

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

string * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoQuad>::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,TPZGeoElRefLess<pzgeom::TPZGeoQuad> *this)

{
  pzgeom::TPZGeoQuad::TypeName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TypeName() const override
    {
		return fGeo.TypeName();
    }